

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_shapes.cxx
# Opt level: O0

void __thiscall xray_re::xr_shape_object::save(xr_shape_object *this,xr_writer *w)

{
  size_type value;
  xr_writer *w_local;
  xr_shape_object *this_local;
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_chunk<unsigned_short>(w,0,&SHAPE_VERSION);
  xr_writer::open_chunk(w,1);
  value = std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::size
                    (&this->m_shapes);
  xr_writer::w_size_u32(w,value);
  xr_writer::w_seq<std::vector<xray_re::shape_def,std::allocator<xray_re::shape_def>>,write_shape>
            (w,&this->m_shapes);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_shape_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(SHAPE_CHUNK_VERSION, SHAPE_VERSION);
	w.open_chunk(SHAPE_CHUNK_SHAPES);
	w.w_size_u32(m_shapes.size());
	w.w_seq(m_shapes, write_shape());
	w.close_chunk();
}